

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::StmtsP5::dfs(StmtsP5 *this,TreeNode *treeNode,SDTNode *fa)

{
  bool bVar1;
  StmtsP *pSVar2;
  reference pvVar3;
  reference pvVar4;
  StmtsP *local_60;
  StmtsP *local_58;
  StmtsP *local_50;
  StmtsP *stmtsP_1;
  Noelse *noelse_1;
  StmtsP *local_28;
  StmtsP *stmtsP;
  SDTNode *fa_local;
  TreeNode *treeNode_local;
  StmtsP5 *this_local;
  
  stmtsP = (StmtsP *)fa;
  fa_local = (SDTNode *)treeNode;
  treeNode_local = (TreeNode *)this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&treeNode->sons);
  if (!bVar1) {
    if (*(int *)((long)&fa_local[2].sons.
                        super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) == 0) {
      pSVar2 = (StmtsP *)operator_new(0x48);
      StmtsP::StmtsP(pSVar2);
      noelse_1 = (Noelse *)pSVar2;
      local_28 = pSVar2;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&noelse_1);
      writeLabel(this->gotoBegin);
      pSVar2 = local_28;
      local_28->gotoNext = this->gotoNext;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,0);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      (**(pSVar2->super_SDTNode)._vptr_SDTNode)(pSVar2,pvVar4,this);
    }
    else if (*(int *)((long)&fa_local[2].sons.
                             super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 1) {
      pSVar2 = (StmtsP *)operator_new(0x48);
      Noelse::Noelse((Noelse *)pSVar2);
      stmtsP_1 = pSVar2;
      pSVar2 = (StmtsP *)operator_new(0x48);
      StmtsP::StmtsP(pSVar2);
      local_58 = stmtsP_1;
      local_50 = pSVar2;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_58);
      local_60 = local_50;
      std::vector<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>::push_back
                (&(this->super_SDTNode).sons,(value_type *)&local_60);
      pSVar2 = stmtsP_1;
      stmtsP_1->gotoBegin = this->gotoNext;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,1);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      (**(pSVar2->super_SDTNode)._vptr_SDTNode)(pSVar2,pvVar4,this);
      writeLabel(this->gotoBegin);
      pSVar2 = local_50;
      local_50->gotoNext = this->gotoNext;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,2);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      (**(pSVar2->super_SDTNode)._vptr_SDTNode)(pSVar2,pvVar4,this);
    }
  }
  return;
}

Assistant:

void StmtsP5::dfs(TreeNode &treeNode, SDT::SDTNode *fa){
        if (treeNode.sons.empty()) return;
        if(treeNode.opt==0){
            StmtsP *stmtsP = new StmtsP;
            sons.push_back(stmtsP);
            writeLabel(gotoBegin);
            stmtsP->gotoNext = gotoNext;
            stmtsP->dfs(SON(0));
        }else if(treeNode.opt==1){
            Noelse *noelse_1 = new Noelse;
            StmtsP *stmtsP_1 = new StmtsP;
            sons.push_back(noelse_1);
            sons.push_back(stmtsP_1);
            noelse_1->gotoNext = gotoNext;
            noelse_1->dfs(SON(1));
            writeLabel(gotoBegin);
            stmtsP_1->gotoNext = gotoNext;
            stmtsP_1->dfs(SON(2));

        }
    }